

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<float>::SolveSOR
          (TPZMatrix<float> *this,int64_t *numiterations,TPZFMatrix<float> *F,
          TPZFMatrix<float> *result,TPZFMatrix<float> *residual,TPZFMatrix<float> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  int iVar1;
  int extraout_var;
  float *pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long row;
  long lVar7;
  int64_t ic;
  long col;
  int64_t j;
  long row_00;
  bool bVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar10;
  float extraout_XMM0_Da_01;
  
  if (residual == F) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
    return;
  }
  if (residual == (TPZFMatrix<float> *)0x0) {
    fVar9 = (float)*tol + (float)*tol + 1.0;
  }
  else {
    fVar9 = Norm(residual);
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (result);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar7 = CONCAT44(extraout_var,iVar1);
  lVar3 = lVar7 + -1;
  bVar8 = direction != -1;
  lVar6 = 0;
  if (bVar8) {
    lVar3 = 0;
  }
  lVar4 = -1;
  if (bVar8) {
    lVar4 = lVar7;
  }
  if (lVar7 == 0 || extraout_var < 0) {
    lVar7 = 0;
  }
  lVar5 = (F->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  while ((lVar6 < *numiterations && (ABS(*tol) < (double)ABS(fVar9)))) {
    fVar9 = 0.0;
    for (col = 0; row = lVar3, col != lVar5; col = col + 1) {
      for (; row != lVar4; row = row + (ulong)bVar8 * 2 + -1) {
        (*(F->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24])
                  (F,row,col);
        fVar10 = extraout_XMM0_Da;
        for (row_00 = 0; lVar7 != row_00; row_00 = row_00 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,row,row_00);
          pfVar2 = TPZFMatrix<float>::operator()(result,row_00,col);
          fVar10 = fVar10 - extraout_XMM0_Da_00 * *pfVar2;
        }
        fVar9 = fVar9 + fVar10 * fVar10;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,row,row);
        pfVar2 = TPZFMatrix<float>::operator()(result,row,col);
        *pfVar2 = (fVar10 * (float)overrelax) / extraout_XMM0_Da_01 + *pfVar2;
      }
    }
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    lVar6 = lVar6 + 1;
  }
  if (residual != (TPZFMatrix<float> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar6;
  *tol = (double)ABS(fVar9);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}